

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.h
# Opt level: O3

void __thiscall winmd::reader::database::initialize(database *this)

{
  file_view *this_00;
  table<winmd::reader::ManifestResource> *tables_17;
  image_section_header *piVar1;
  ushort uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  short *psVar7;
  uint8_t *puVar8;
  char cVar9;
  byte bVar10;
  char cVar11;
  byte bVar12;
  table_base *ptVar13;
  undefined4 uVar14;
  table_base *this_01;
  table_base *this_02;
  bool bVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  byte bVar19;
  int *piVar20;
  image_section_header *piVar21;
  size_t sVar22;
  table_base *ptVar23;
  undefined8 uVar24;
  undefined7 extraout_var;
  uint8_t uVar25;
  uint8_t uVar26;
  uint8_t uVar27;
  uint8_t uVar28;
  byte bVar29;
  int iVar30;
  uint uVar31;
  uint8_t uVar32;
  ulong uVar33;
  uint8_t uVar34;
  uint8_t uVar35;
  uint8_t uVar36;
  short sVar37;
  uint uVar38;
  uint8_t *puVar39;
  uint8_t uVar40;
  int iVar41;
  int iVar42;
  uint uVar43;
  size_type __rlen;
  byte bVar44;
  ulong uVar45;
  uint8_t uVar46;
  bool bVar47;
  byte f;
  byte_view *pbVar48;
  byte_view *pbVar49;
  uint32_t *puVar50;
  string local_1e8;
  ulong local_1c8;
  array<char,_12UL> name;
  byte_view local_140;
  table_base *local_130;
  table_base *local_128;
  table_base *local_120;
  table_base *local_118;
  table_base *local_110;
  table_base *local_108;
  table_base *local_100;
  table_base *local_f8;
  table_base *local_f0;
  table_base *local_e8;
  table_base *local_e0;
  table_base *local_d8;
  uint32_t *local_d0;
  uint32_t *local_c8;
  table_base *local_c0;
  table_base *local_b8;
  table_base *local_b0;
  table_base *local_a8;
  table_base *local_a0;
  table_base *local_98;
  table_base *local_90;
  table_base *local_88;
  table_base *local_80;
  table_base *local_78;
  table_base *local_70;
  byte_view tables;
  
  this_00 = &this->m_view;
  byte_view::check_available(&this_00->super_byte_view,0x40);
  psVar7 = (short *)(this->m_view).super_byte_view.m_first;
  if (*psVar7 != 0x5a4d) {
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"Invalid DOS signature","")
    ;
    impl::throw_invalid(&local_1e8);
  }
  uVar43 = *(uint *)(psVar7 + 0x1e);
  uVar38 = uVar43 + 0xf8;
  byte_view::check_available(&this_00->super_byte_view,uVar38);
  puVar39 = (this_00->super_byte_view).m_first;
  uVar2 = *(ushort *)(puVar39 + (ulong)uVar43 + 6);
  if ((ushort)(uVar2 - 0x65) < 0xff9c) {
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,"Invalid PE section count","");
    impl::throw_invalid(&local_1e8);
  }
  pbVar48 = &this_00->super_byte_view;
  if (*(short *)(puVar39 + (ulong)uVar43 + 0x18) == 0x10b) {
    piVar20 = (int *)(puVar39 + (ulong)uVar43 + 0xe8);
    iVar42 = 0x120;
  }
  else {
    if (*(short *)(puVar39 + (ulong)uVar43 + 0x18) != 0x20b) {
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,"Invalid optional header magic value","");
      impl::throw_invalid(&local_1e8);
    }
    uVar38 = uVar43 + 0x108;
    byte_view::check_available(&this_00->super_byte_view,uVar38);
    piVar20 = (int *)((this_00->super_byte_view).m_first + (ulong)uVar43 + 0xf8);
    iVar42 = 0x130;
  }
  iVar41 = *piVar20;
  byte_view::check_available(&this_00->super_byte_view,uVar43 + iVar42);
  puVar39 = (this_00->super_byte_view).m_first + uVar38;
  piVar1 = (image_section_header *)(puVar39 + (ulong)uVar2 * 0x28);
  piVar21 = std::
            __find_if<winmd::impl::image_section_header_const*,__gnu_cxx::__ops::_Iter_pred<winmd::reader::database::section_from_rva(winmd::impl::image_section_header_const*,winmd::impl::image_section_header_const*,unsigned_int)::_lambda(auto:1&&)_1_>>
                      (puVar39,piVar1,iVar41);
  if (piVar21 == piVar1) {
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,"PE section containing CLI header not found","");
    impl::throw_invalid(&local_1e8);
  }
  iVar41 = iVar41 - piVar21->VirtualAddress;
  uVar45 = (ulong)(piVar21->PointerToRawData + iVar41);
  byte_view::check_available(&this_00->super_byte_view,piVar21->PointerToRawData + iVar41 + 0x48);
  puVar8 = (this_00->super_byte_view).m_first;
  if (*(int *)(puVar8 + uVar45) != 0x48) {
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"Invalid CLI header","");
    impl::throw_invalid(&local_1e8);
  }
  iVar42 = *(int *)(puVar8 + uVar45 + 8);
  piVar21 = std::
            __find_if<winmd::impl::image_section_header_const*,__gnu_cxx::__ops::_Iter_pred<winmd::reader::database::section_from_rva(winmd::impl::image_section_header_const*,winmd::impl::image_section_header_const*,unsigned_int)::_lambda(auto:1&&)_1_>>
                      (puVar39,piVar1,iVar42);
  if (piVar21 == piVar1) {
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,"PE section containing CLI metadata not found","");
    impl::throw_invalid(&local_1e8);
  }
  iVar42 = iVar42 - piVar21->VirtualAddress;
  uVar43 = piVar21->PointerToRawData + iVar42;
  byte_view::check_available(&this_00->super_byte_view,piVar21->PointerToRawData + iVar42 + 4);
  if (*(int *)((this_00->super_byte_view).m_first + uVar43) != 0x424a5342) {
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,"CLI metadata magic signature not found","");
    impl::throw_invalid(&local_1e8);
  }
  byte_view::check_available(&this_00->super_byte_view,uVar43 + 0x10);
  iVar42 = *(int *)((this->m_view).super_byte_view.m_first + (uVar43 + 0xc));
  uVar38 = iVar42 + 0x14 + uVar43;
  local_1c8 = (ulong)uVar43;
  byte_view::check_available(&this_00->super_byte_view,uVar38);
  sVar37 = *(short *)((this->m_view).super_byte_view.m_first + (iVar42 + uVar43 + 0x12));
  byte_view::check_available(&this_00->super_byte_view,uVar38);
  local_140.m_first = (this->m_view).super_byte_view.m_first + uVar38;
  local_140.m_last = (this->m_view).super_byte_view.m_last;
  tables.m_first = (uint8_t *)0x0;
  tables.m_last = (uint8_t *)0x0;
  if (sVar37 != 0) {
    do {
      byte_view::check_available(&local_140,8);
      iVar42 = *(int *)local_140.m_first;
      uVar43 = *(uint *)((long)local_140.m_first + 4);
      byte_view::check_available(&local_140,0x14);
      name._M_elems._0_8_ = *(undefined8 *)((long)local_140.m_first + 8);
      name._M_elems._8_4_ = *(int *)((long)local_140.m_first + 0x10);
      sVar22 = strlen(name._M_elems);
      uVar14 = name._M_elems._0_4_;
      pbVar49 = pbVar48;
      switch(sVar22) {
      case 2:
        if (name._M_elems._0_2_ != 0x7e23) goto switchD_00165701_caseD_4;
        uVar38 = iVar42 + (int)local_1c8;
        byte_view::check_available(pbVar48,uVar43 + uVar38);
        tables.m_first = pbVar48->m_first + uVar38;
        tables.m_last = tables.m_first + uVar43;
        break;
      case 3:
        if (name._M_elems[2] != 'S' || name._M_elems._0_2_ != 0x5523) goto switchD_00165701_caseD_4;
        break;
      default:
switchD_00165701_caseD_4:
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,"Unknown metadata stream","");
        impl::throw_invalid(&local_1e8);
      case 5:
        if (name._M_elems[4] == 'b' && uVar14 == 0x6f6c4223) {
          uVar38 = iVar42 + (int)local_1c8;
          byte_view::check_available(pbVar48,uVar43 + uVar38);
          puVar39 = (this->m_view).super_byte_view.m_first + uVar38;
          (this->m_blobs).m_first = puVar39;
          (this->m_blobs).m_last = puVar39 + uVar43;
          pbVar49 = pbVar48;
        }
        else {
          if (name._M_elems[4] != 'D' || uVar14 != 0x49554723) goto switchD_00165701_caseD_4;
          uVar38 = iVar42 + (int)local_1c8;
          byte_view::check_available(pbVar48,uVar43 + uVar38);
          puVar39 = (this->m_view).super_byte_view.m_first + uVar38;
          (this->m_guids).m_first = puVar39;
          (this->m_guids).m_last = puVar39 + uVar43;
          pbVar49 = pbVar48;
        }
        break;
      case 8:
        if (name._M_elems._0_8_ != 0x73676e6972745323) goto switchD_00165701_caseD_4;
        uVar38 = iVar42 + (int)local_1c8;
        byte_view::check_available(pbVar48,uVar43 + uVar38);
        puVar39 = (this->m_view).super_byte_view.m_first + uVar38;
        (this->m_strings).m_first = puVar39;
        (this->m_strings).m_last = puVar39 + uVar43;
        pbVar49 = pbVar48;
      }
      uVar43 = (uint)sVar22 & 0xfffffffc;
      byte_view::check_available(&local_140,uVar43 + 0xc);
      local_140.m_first = (uint8_t *)((long)local_140.m_first + (ulong)uVar43 + 0xc);
      sVar37 = sVar37 + -1;
      pbVar48 = pbVar49;
    } while (sVar37 != 0);
  }
  byte_view::check_available(&tables,7);
  local_1c8 = (ulong)tables.m_first[6];
  byte_view::check_available(&tables,0x10);
  uVar45 = *(ulong *)(tables.m_first + 8);
  byte_view::check_available(&tables,0x18);
  local_140.m_first = tables.m_first + 0x18;
  local_140.m_last = tables.m_last;
  puVar50 = &(this->GenericParamConstraint).super_table_base.m_row_count;
  local_f0 = (table_base *)&(this->MethodSpec).super_table_base.m_row_count;
  local_f8 = (table_base *)&(this->GenericParam).super_table_base.m_row_count;
  local_100 = (table_base *)&(this->NestedClass).super_table_base.m_row_count;
  local_108 = (table_base *)&(this->ManifestResource).super_table_base.m_row_count;
  local_110 = (table_base *)&(this->ExportedType).super_table_base.m_row_count;
  local_118 = (table_base *)&(this->File).super_table_base.m_row_count;
  local_120 = (table_base *)&(this->AssemblyRefOS).super_table_base.m_row_count;
  local_128 = (table_base *)&(this->AssemblyRefProcessor).super_table_base.m_row_count;
  local_130 = (table_base *)&(this->AssemblyRef).super_table_base.m_row_count;
  local_70 = (table_base *)&(this->AssemblyProcessor).super_table_base.m_row_count;
  local_78 = (table_base *)&(this->Assembly).super_table_base.m_row_count;
  local_80 = (table_base *)&(this->FieldRVA).super_table_base.m_row_count;
  local_88 = (table_base *)&(this->ImplMap).super_table_base.m_row_count;
  local_90 = (table_base *)&(this->TypeSpec).super_table_base.m_row_count;
  local_98 = (table_base *)&(this->ModuleRef).super_table_base.m_row_count;
  local_a0 = (table_base *)&(this->MethodImpl).super_table_base.m_row_count;
  local_a8 = (table_base *)&(this->MethodSemantics).super_table_base.m_row_count;
  local_b0 = (table_base *)&(this->Property).super_table_base.m_row_count;
  local_b8 = (table_base *)&(this->PropertyMap).super_table_base.m_row_count;
  local_c0 = (table_base *)&(this->Event).super_table_base.m_row_count;
  local_c8 = &(this->EventMap).super_table_base.m_row_count;
  local_d0 = &(this->TypeRef).super_table_base.m_row_count;
  uVar33 = 0;
  do {
    if ((uVar45 >> (uVar33 & 0x3f) & 1) != 0) {
      byte_view::check_available(&local_140,4);
      uVar3 = *(uint32_t *)local_140.m_first;
      byte_view::check_available(&local_140,4);
      local_140.m_first = (uint8_t *)((long)local_140.m_first + 4);
      ptVar23 = (table_base *)&(this->Module).super_table_base.m_row_count;
      switch(uVar33 & 0xffffffff) {
      case 0:
        break;
      case 1:
        ptVar23 = (table_base *)local_d0;
        break;
      case 2:
        ptVar23 = (table_base *)&(this->TypeDef).super_table_base.m_row_count;
        break;
      default:
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,"Unknown metadata table","");
        impl::throw_invalid(&local_1e8);
      case 4:
        ptVar23 = (table_base *)&(this->Field).super_table_base.m_row_count;
        break;
      case 6:
        ptVar23 = (table_base *)&(this->MethodDef).super_table_base.m_row_count;
        break;
      case 8:
        ptVar23 = (table_base *)&(this->Param).super_table_base.m_row_count;
        break;
      case 9:
        ptVar23 = (table_base *)&(this->InterfaceImpl).super_table_base.m_row_count;
        break;
      case 10:
        ptVar23 = (table_base *)&(this->MemberRef).super_table_base.m_row_count;
        break;
      case 0xb:
        ptVar23 = (table_base *)&(this->Constant).super_table_base.m_row_count;
        break;
      case 0xc:
        ptVar23 = (table_base *)&(this->CustomAttribute).super_table_base.m_row_count;
        break;
      case 0xd:
        ptVar23 = (table_base *)&(this->FieldMarshal).super_table_base.m_row_count;
        break;
      case 0xe:
        ptVar23 = (table_base *)&(this->DeclSecurity).super_table_base.m_row_count;
        break;
      case 0xf:
        ptVar23 = (table_base *)&(this->ClassLayout).super_table_base.m_row_count;
        break;
      case 0x10:
        ptVar23 = (table_base *)&(this->FieldLayout).super_table_base.m_row_count;
        break;
      case 0x11:
        ptVar23 = (table_base *)&(this->StandAloneSig).super_table_base.m_row_count;
        break;
      case 0x12:
        ptVar23 = (table_base *)local_c8;
        break;
      case 0x14:
        ptVar23 = local_c0;
        break;
      case 0x15:
        ptVar23 = local_b8;
        break;
      case 0x17:
        ptVar23 = local_b0;
        break;
      case 0x18:
        ptVar23 = local_a8;
        break;
      case 0x19:
        ptVar23 = local_a0;
        break;
      case 0x1a:
        ptVar23 = local_98;
        break;
      case 0x1b:
        ptVar23 = local_90;
        break;
      case 0x1c:
        ptVar23 = local_88;
        break;
      case 0x1d:
        ptVar23 = local_80;
        break;
      case 0x20:
        ptVar23 = local_78;
        break;
      case 0x21:
        ptVar23 = local_70;
        break;
      case 0x22:
        ptVar23 = (table_base *)&(this->AssemblyOS).super_table_base.m_row_count;
        break;
      case 0x23:
        ptVar23 = local_130;
        break;
      case 0x24:
        ptVar23 = local_128;
        break;
      case 0x25:
        ptVar23 = local_120;
        break;
      case 0x26:
        ptVar23 = local_118;
        break;
      case 0x27:
        ptVar23 = local_110;
        break;
      case 0x28:
        ptVar23 = local_108;
        break;
      case 0x29:
        ptVar23 = local_100;
        break;
      case 0x2a:
        ptVar23 = local_f8;
        break;
      case 0x2b:
        ptVar23 = local_f0;
        break;
      case 0x2c:
        ptVar23 = (table_base *)puVar50;
      }
      *(uint32_t *)ptVar23 = uVar3;
    }
    uVar33 = uVar33 + 1;
  } while (uVar33 != 0x40);
  uVar31 = ((uint)local_1c8 & 4) >> 2;
  bVar12 = (byte)local_1c8;
  iVar42 = uVar31 * 2;
  local_d0 = (uint32_t *)(ulong)(iVar42 + 2);
  uVar24 = CONCAT71((int7)((local_1c8 & 0xffffff01) >> 8),(char)(local_1c8 & 0xffffff01) * '\x02');
  iVar41 = (int)uVar24 + 2;
  local_118 = &(this->TypeDef).super_table_base;
  local_f0 = &(this->TypeSpec).super_table_base;
  bVar15 = 0x3fff < (this->TypeSpec).super_table_base.m_row_count ||
           (0x3fff < (this->TypeRef).super_table_base.m_row_count ||
           0x3fff < (this->TypeDef).super_table_base.m_row_count);
  local_c8 = (uint32_t *)CONCAT71((int7)((ulong)local_f0 >> 8),bVar15);
  uVar16 = bVar15 * '\x02' + '\x02';
  local_c0 = &(this->Field).super_table_base;
  local_b0 = &(this->Param).super_table_base;
  bVar10 = (0x3fff < (this->Property).super_table_base.m_row_count ||
           (0x3fff < (this->Param).super_table_base.m_row_count ||
           0x3fff < (this->Field).super_table_base.m_row_count)) * '\x02';
  local_f8 = &(this->Property).super_table_base;
  local_b8 = &(this->MethodDef).super_table_base;
  local_a8 = &(this->InterfaceImpl).super_table_base;
  local_120 = &(this->MemberRef).super_table_base;
  local_130 = &(this->Module).super_table_base;
  local_110 = &(this->Event).super_table_base;
  local_108 = &(this->StandAloneSig).super_table_base;
  local_100 = &(this->ModuleRef).super_table_base;
  local_a0 = &(this->Assembly).super_table_base;
  local_128 = &(this->AssemblyRef).super_table_base;
  local_98 = &(this->File).super_table_base;
  local_90 = &(this->ExportedType).super_table_base;
  tables_17 = &this->ManifestResource;
  local_80 = &(this->GenericParam).super_table_base;
  local_70 = &(this->GenericParamConstraint).super_table_base;
  local_78 = &(this->MethodSpec).super_table_base;
  local_88 = &tables_17->super_table_base;
  uVar17 = composite_index_size<winmd::reader::table<winmd::reader::MethodDef>,winmd::reader::table<winmd::reader::Field>,winmd::reader::table<winmd::reader::TypeRef>,winmd::reader::table<winmd::reader::TypeDef>,winmd::reader::table<winmd::reader::Param>,winmd::reader::table<winmd::reader::InterfaceImpl>,winmd::reader::table<winmd::reader::MemberRef>,winmd::reader::table<winmd::reader::Module>,winmd::reader::table<winmd::reader::Property>,winmd::reader::table<winmd::reader::Event>,winmd::reader::table<winmd::reader::StandAloneSig>,winmd::reader::table<winmd::reader::ModuleRef>,winmd::reader::table<winmd::reader::TypeSpec>,winmd::reader::table<winmd::reader::Assembly>,winmd::reader::table<winmd::reader::AssemblyRef>,winmd::reader::table<winmd::reader::File>,winmd::reader::table<winmd::reader::ExportedType>,winmd::reader::table<winmd::reader::ManifestResource>,winmd::reader::table<winmd::reader::GenericParam>,winmd::reader::table<winmd::reader::GenericParamConstraint>,winmd::reader::table<winmd::reader::MethodSpec>>
                     ((table<winmd::reader::MethodDef> *)local_b8,
                      (table<winmd::reader::Field> *)local_c0,&this->TypeRef,
                      (table<winmd::reader::TypeDef> *)local_118,
                      (table<winmd::reader::Param> *)local_b0,
                      (table<winmd::reader::InterfaceImpl> *)local_a8,
                      (table<winmd::reader::MemberRef> *)local_120,
                      (table<winmd::reader::Module> *)local_130,
                      (table<winmd::reader::Property> *)local_f8,
                      (table<winmd::reader::Event> *)local_110,
                      (table<winmd::reader::StandAloneSig> *)local_108,
                      (table<winmd::reader::ModuleRef> *)local_100,
                      (table<winmd::reader::TypeSpec> *)local_f0,
                      (table<winmd::reader::Assembly> *)local_a0,
                      (table<winmd::reader::AssemblyRef> *)local_128,
                      (table<winmd::reader::File> *)local_98,
                      (table<winmd::reader::ExportedType> *)local_90,tables_17,
                      (table<winmd::reader::GenericParam> *)local_80,
                      (table<winmd::reader::GenericParamConstraint> *)local_70,
                      (table<winmd::reader::MethodSpec> *)local_78);
  local_e0 = (table_base *)CONCAT71(extraout_var,uVar17);
  bVar15 = 0x7fff < (this->Field).super_table_base.m_row_count;
  uVar25 = (0x7fff < (this->Param).super_table_base.m_row_count || bVar15) * '\x02' + '\x02';
  uVar43 = (this->TypeDef).super_table_base.m_row_count;
  uVar38 = (this->MethodDef).super_table_base.m_row_count;
  bVar44 = (0x3fff < (this->Assembly).super_table_base.m_row_count ||
           (0x3fff < uVar38 || 0x3fff < uVar43)) * '\x02';
  uVar4 = (this->TypeRef).super_table_base.m_row_count;
  uVar5 = (this->ModuleRef).super_table_base.m_row_count;
  uVar26 = (0x1fff < (this->TypeSpec).super_table_base.m_row_count ||
           ((0x1fff < uVar5 || 0x1fff < uVar38) || (0x1fff < uVar4 || 0x1fff < uVar43))) * '\x02' +
           '\x02';
  uVar27 = (0x7fff < (this->Property).super_table_base.m_row_count ||
           0x7fff < (this->Event).super_table_base.m_row_count) * '\x02' + '\x02';
  bVar47 = 0x7fff < uVar38;
  uVar6 = (this->MemberRef).super_table_base.m_row_count;
  uVar28 = (0x7fff < uVar6 || bVar47) * '\x02' + '\x02';
  bVar19 = (bVar47 || bVar15) * '\x02';
  bVar15 = 0x3fff < (this->AssemblyRef).super_table_base.m_row_count;
  uVar36 = (0x3fff < (this->ExportedType).super_table_base.m_row_count ||
           (bVar15 || 0x3fff < (this->File).super_table_base.m_row_count)) * '\x02' + '\x02';
  uVar46 = (0x1fff < uVar6 || 0x1fff < uVar38) * '\x02' + '\x02';
  uVar18 = (0x3fff < uVar4 ||
           ((0x3fff < uVar5 || 0x3fff < (this->Module).super_table_base.m_row_count) || bVar15)) *
           '\x02' + '\x02';
  bVar29 = (char)iVar42 + 0x12;
  iVar42 = (uint)bVar29 + iVar41;
  iVar30 = iVar42 + iVar41;
  (this->Assembly).super_table_base.m_row_size = (uint8_t)iVar30;
  local_e8 = (table_base *)
             CONCAT44(local_e8._4_4_,
                      (int)CONCAT71((int7)((ulong)tables_17 >> 8),bVar44) +
                      (int)CONCAT71((uint7)(uint3)((uint)iVar30 >> 8),2));
  ptVar23 = &(this->Assembly).super_table_base;
  ptVar13 = &(this->Assembly).super_table_base;
  (ptVar23->m_columns)._M_elems[0].offset = '\0';
  (ptVar23->m_columns)._M_elems[0].size = '\x04';
  (ptVar13->m_columns)._M_elems[1].offset = '\x04';
  (ptVar13->m_columns)._M_elems[1].size = '\b';
  ptVar23 = &(this->Assembly).super_table_base;
  (ptVar23->m_columns)._M_elems[2].offset = '\f';
  (ptVar23->m_columns)._M_elems[2].size = '\x04';
  (this->Assembly).super_table_base.m_columns._M_elems[3].offset = '\x10';
  uVar32 = (uint8_t)local_d0;
  (this->Assembly).super_table_base.m_columns._M_elems[3].size = uVar32;
  (this->Assembly).super_table_base.m_columns._M_elems[4].offset = bVar29;
  cVar9 = (0x7fff < uVar43 || bVar47) * '\x02';
  uVar40 = (uint8_t)iVar41;
  (this->Assembly).super_table_base.m_columns._M_elems[4].size = uVar40;
  (this->Assembly).super_table_base.m_columns._M_elems[5].offset = (uint8_t)iVar42;
  (this->Assembly).super_table_base.m_columns._M_elems[5].size = uVar40;
  ptVar23 = &(this->AssemblyOS).super_table_base;
  (this->AssemblyOS).super_table_base.m_row_size = '\f';
  (ptVar23->m_columns)._M_elems[0].offset = '\0';
  (ptVar23->m_columns)._M_elems[0].size = '\x04';
  (this->AssemblyOS).super_table_base.m_columns._M_elems[1].offset = '\x04';
  *(undefined2 *)&(this->AssemblyOS).super_table_base.m_columns._M_elems[1].size = 0x804;
  (this->AssemblyOS).super_table_base.m_columns._M_elems[2].size = '\x04';
  (this->AssemblyProcessor).super_table_base.m_row_size = '\x04';
  (this->AssemblyProcessor).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->AssemblyProcessor).super_table_base.m_columns._M_elems[0].size = '\x04';
  local_d8 = (table_base *)CONCAT44(local_d8._4_4_,(int)CONCAT71(0x80,cVar9) + 2);
  iVar42 = ((uint)local_1c8 & 1) * 2 + 2;
  local_1c8 = CONCAT44(local_1c8._4_4_,iVar42);
  f = (byte)uVar24;
  uVar17 = (uint8_t)iVar42;
  table_base::set_columns(local_128,'\b','\x04',(char)uVar31 * '\x02' + '\x02',uVar17,uVar17,f);
  this_01 = local_130;
  cVar11 = (0xffff < (this->AssemblyRef).super_table_base.m_row_count) * '\x02';
  (this->AssemblyRefOS).super_table_base.m_row_size = cVar11 + '\x0e';
  ptVar23 = &(this->AssemblyRefOS).super_table_base;
  ptVar13 = &(this->AssemblyRefOS).super_table_base;
  (ptVar23->m_columns)._M_elems[0].offset = '\0';
  (ptVar23->m_columns)._M_elems[0].size = '\x04';
  (ptVar13->m_columns)._M_elems[1].offset = '\x04';
  (ptVar13->m_columns)._M_elems[1].size = '\x04';
  ptVar23 = &(this->AssemblyRefOS).super_table_base;
  (ptVar23->m_columns)._M_elems[2].offset = '\b';
  (ptVar23->m_columns)._M_elems[2].size = '\x04';
  (this->AssemblyRefOS).super_table_base.m_columns._M_elems[3].offset = '\f';
  (this->AssemblyRefOS).super_table_base.m_columns._M_elems[3].size = cVar11 + '\x02';
  (this->AssemblyRefProcessor).super_table_base.m_row_size = cVar11 + '\x06';
  (this->AssemblyRefProcessor).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->AssemblyRefProcessor).super_table_base.m_columns._M_elems[0].size = '\x04';
  (this->AssemblyRefProcessor).super_table_base.m_columns._M_elems[1].offset = '\x04';
  (this->AssemblyRefProcessor).super_table_base.m_columns._M_elems[1].size = cVar11 + '\x02';
  bVar29 = (0xffff < (this->TypeDef).super_table_base.m_row_count) * '\x02';
  uVar17 = bVar29 + 2;
  (this->ClassLayout).super_table_base.m_row_size = bVar29 | 8;
  ptVar23 = &(this->ClassLayout).super_table_base;
  ptVar13 = &(this->ClassLayout).super_table_base;
  (ptVar23->m_columns)._M_elems[0].offset = '\0';
  (ptVar23->m_columns)._M_elems[0].size = '\x02';
  (ptVar13->m_columns)._M_elems[1].offset = '\x02';
  (ptVar13->m_columns)._M_elems[1].size = '\x04';
  (this->ClassLayout).super_table_base.m_columns._M_elems[2].offset = '\x06';
  (this->ClassLayout).super_table_base.m_columns._M_elems[2].size = uVar17;
  bVar29 = bVar10 | 4;
  (this->Constant).super_table_base.m_row_size = bVar29 + uVar32;
  (this->Constant).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->Constant).super_table_base.m_columns._M_elems[0].size = '\x02';
  (this->Constant).super_table_base.m_columns._M_elems[1].offset = '\x02';
  (this->Constant).super_table_base.m_columns._M_elems[1].size = bVar10 + 2;
  (this->Constant).super_table_base.m_columns._M_elems[2].offset = bVar29;
  (this->Constant).super_table_base.m_columns._M_elems[2].size = uVar32;
  uVar35 = (uint8_t)local_e0;
  uVar34 = uVar46 + uVar35;
  (this->CustomAttribute).super_table_base.m_row_size = uVar34 + uVar32;
  (this->CustomAttribute).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->CustomAttribute).super_table_base.m_columns._M_elems[0].size = uVar35;
  (this->CustomAttribute).super_table_base.m_columns._M_elems[1].offset = uVar35;
  (this->CustomAttribute).super_table_base.m_columns._M_elems[1].size = uVar46;
  (this->CustomAttribute).super_table_base.m_columns._M_elems[2].offset = uVar34;
  (this->CustomAttribute).super_table_base.m_columns._M_elems[2].size = uVar32;
  bVar44 = bVar44 | 4;
  (this->DeclSecurity).super_table_base.m_row_size = bVar44 + uVar32;
  (this->DeclSecurity).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->DeclSecurity).super_table_base.m_columns._M_elems[0].size = '\x02';
  (this->DeclSecurity).super_table_base.m_columns._M_elems[1].offset = '\x02';
  (this->DeclSecurity).super_table_base.m_columns._M_elems[1].size = (uint8_t)local_e8;
  (this->DeclSecurity).super_table_base.m_columns._M_elems[2].offset = bVar44;
  (this->DeclSecurity).super_table_base.m_columns._M_elems[2].size = uVar32;
  uVar34 = (0xffff < (this->Event).super_table_base.m_row_count) * '\x02' + '\x02';
  (this->EventMap).super_table_base.m_row_size = uVar34 + uVar17;
  (this->EventMap).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->EventMap).super_table_base.m_columns._M_elems[0].size = uVar17;
  (this->EventMap).super_table_base.m_columns._M_elems[1].offset = uVar17;
  (this->EventMap).super_table_base.m_columns._M_elems[1].size = uVar34;
  bVar10 = f | 4;
  (this->Event).super_table_base.m_row_size = uVar16 + bVar10;
  (this->Event).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->Event).super_table_base.m_columns._M_elems[0].size = '\x02';
  (this->Event).super_table_base.m_columns._M_elems[1].offset = '\x02';
  (this->Event).super_table_base.m_columns._M_elems[1].size = uVar40;
  (this->Event).super_table_base.m_columns._M_elems[2].offset = f | 4;
  (this->Event).super_table_base.m_columns._M_elems[2].size = uVar16;
  uVar34 = f + 10;
  (this->ExportedType).super_table_base.m_row_size = uVar36 + uVar34 + uVar40;
  ptVar23 = &(this->ExportedType).super_table_base;
  ptVar13 = &(this->ExportedType).super_table_base;
  (ptVar23->m_columns)._M_elems[0].offset = '\0';
  (ptVar23->m_columns)._M_elems[0].size = '\x04';
  (ptVar13->m_columns)._M_elems[1].offset = '\x04';
  (ptVar13->m_columns)._M_elems[1].size = '\x04';
  (this->ExportedType).super_table_base.m_columns._M_elems[2].offset = '\b';
  (this->ExportedType).super_table_base.m_columns._M_elems[2].size = uVar40;
  (this->ExportedType).super_table_base.m_columns._M_elems[3].offset = uVar34;
  (this->ExportedType).super_table_base.m_columns._M_elems[3].size = uVar40;
  (this->ExportedType).super_table_base.m_columns._M_elems[4].offset = uVar34 + uVar40;
  (this->ExportedType).super_table_base.m_columns._M_elems[4].size = uVar36;
  (this->Field).super_table_base.m_row_size = uVar32 + bVar10;
  (this->Field).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->Field).super_table_base.m_columns._M_elems[0].size = '\x02';
  (this->Field).super_table_base.m_columns._M_elems[1].offset = '\x02';
  (this->Field).super_table_base.m_columns._M_elems[1].size = uVar40;
  (this->Field).super_table_base.m_columns._M_elems[2].offset = f | 4;
  (this->Field).super_table_base.m_columns._M_elems[2].size = uVar32;
  cVar11 = (0xffff < (this->Field).super_table_base.m_row_count) * '\x02';
  uVar17 = cVar11 + '\x02';
  uVar35 = cVar11 + '\x06';
  (this->FieldLayout).super_table_base.m_row_size = uVar35;
  (this->FieldLayout).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->FieldLayout).super_table_base.m_columns._M_elems[0].size = '\x04';
  (this->FieldLayout).super_table_base.m_columns._M_elems[1].offset = '\x04';
  (this->FieldLayout).super_table_base.m_columns._M_elems[1].size = uVar17;
  (this->FieldMarshal).super_table_base.m_row_size = uVar32 + uVar25;
  (this->FieldMarshal).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->FieldMarshal).super_table_base.m_columns._M_elems[0].size = uVar25;
  (this->FieldMarshal).super_table_base.m_columns._M_elems[1].offset = uVar25;
  (this->FieldMarshal).super_table_base.m_columns._M_elems[1].size = uVar32;
  (this->FieldRVA).super_table_base.m_row_size = uVar35;
  (this->FieldRVA).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->FieldRVA).super_table_base.m_columns._M_elems[0].size = '\x04';
  (this->FieldRVA).super_table_base.m_columns._M_elems[1].offset = '\x04';
  (this->FieldRVA).super_table_base.m_columns._M_elems[1].size = uVar17;
  uVar25 = f + 6;
  (this->File).super_table_base.m_row_size = uVar32 + uVar25;
  (this->File).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->File).super_table_base.m_columns._M_elems[0].size = '\x04';
  (this->File).super_table_base.m_columns._M_elems[1].offset = '\x04';
  (this->File).super_table_base.m_columns._M_elems[1].size = uVar40;
  (this->File).super_table_base.m_columns._M_elems[2].offset = uVar25;
  (this->File).super_table_base.m_columns._M_elems[2].size = uVar32;
  uVar17 = cVar9 + '\x06';
  (this->GenericParam).super_table_base.m_row_size = uVar17 + uVar40;
  ptVar23 = &(this->GenericParam).super_table_base;
  ptVar13 = &(this->GenericParam).super_table_base;
  (ptVar23->m_columns)._M_elems[0].offset = '\0';
  (ptVar23->m_columns)._M_elems[0].size = '\x02';
  (ptVar13->m_columns)._M_elems[1].offset = '\x02';
  (ptVar13->m_columns)._M_elems[1].size = '\x02';
  (this->GenericParam).super_table_base.m_columns._M_elems[2].offset = '\x04';
  (this->GenericParam).super_table_base.m_columns._M_elems[2].size = (uint8_t)local_d8;
  (this->GenericParam).super_table_base.m_columns._M_elems[3].offset = uVar17;
  (this->GenericParam).super_table_base.m_columns._M_elems[3].size = uVar40;
  uVar17 = (0xffff < (this->GenericParam).super_table_base.m_row_count) * '\x02' + '\x02';
  (this->GenericParamConstraint).super_table_base.m_row_size = uVar17 + uVar16;
  (this->GenericParamConstraint).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->GenericParamConstraint).super_table_base.m_columns._M_elems[0].size = uVar17;
  (this->GenericParamConstraint).super_table_base.m_columns._M_elems[1].offset = uVar17;
  (this->GenericParamConstraint).super_table_base.m_columns._M_elems[1].size = uVar16;
  uVar35 = (0xffff < (this->ModuleRef).super_table_base.m_row_count) * '\x02' + '\x02';
  bVar44 = bVar19 | 4;
  uVar17 = bVar44 + uVar40;
  (this->ImplMap).super_table_base.m_row_size = uVar35 + uVar17;
  (this->ImplMap).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->ImplMap).super_table_base.m_columns._M_elems[0].size = '\x02';
  (this->ImplMap).super_table_base.m_columns._M_elems[1].offset = '\x02';
  (this->ImplMap).super_table_base.m_columns._M_elems[1].size = bVar19 + 2;
  (this->ImplMap).super_table_base.m_columns._M_elems[2].offset = bVar44;
  (this->ImplMap).super_table_base.m_columns._M_elems[2].size = uVar40;
  (this->ImplMap).super_table_base.m_columns._M_elems[3].offset = uVar17;
  (this->ImplMap).super_table_base.m_columns._M_elems[3].size = uVar35;
  uVar35 = (0xffff < (this->TypeDef).super_table_base.m_row_count) * '\x02' + '\x02';
  (this->InterfaceImpl).super_table_base.m_row_size = uVar35 + uVar16;
  (this->InterfaceImpl).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->InterfaceImpl).super_table_base.m_columns._M_elems[0].size = uVar35;
  (this->InterfaceImpl).super_table_base.m_columns._M_elems[1].offset = uVar35;
  (this->InterfaceImpl).super_table_base.m_columns._M_elems[1].size = uVar16;
  (this->ManifestResource).super_table_base.m_row_size = uVar36 + uVar34;
  ptVar23 = &(this->ManifestResource).super_table_base;
  ptVar13 = &(this->ManifestResource).super_table_base;
  (ptVar23->m_columns)._M_elems[0].offset = '\0';
  (ptVar23->m_columns)._M_elems[0].size = '\x04';
  (ptVar13->m_columns)._M_elems[1].offset = '\x04';
  (ptVar13->m_columns)._M_elems[1].size = '\x04';
  (this->ManifestResource).super_table_base.m_columns._M_elems[2].offset = '\b';
  (this->ManifestResource).super_table_base.m_columns._M_elems[2].size = uVar40;
  (this->ManifestResource).super_table_base.m_columns._M_elems[3].offset = uVar34;
  (this->ManifestResource).super_table_base.m_columns._M_elems[3].size = uVar36;
  (this->MemberRef).super_table_base.m_row_size = uVar26 + uVar40 + uVar32;
  (this->MemberRef).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->MemberRef).super_table_base.m_columns._M_elems[0].size = uVar26;
  (this->MemberRef).super_table_base.m_columns._M_elems[1].offset = uVar26;
  (this->MemberRef).super_table_base.m_columns._M_elems[1].size = uVar40;
  (this->MemberRef).super_table_base.m_columns._M_elems[2].offset = uVar26 + uVar40;
  (this->MemberRef).super_table_base.m_columns._M_elems[2].size = uVar32;
  uVar17 = (0xffff < (this->Param).super_table_base.m_row_count) * '\x02' + '\x02';
  (this->MethodDef).super_table_base.m_row_size = uVar17 + uVar34 + uVar32;
  ptVar23 = &(this->MethodDef).super_table_base;
  ptVar13 = &(this->MethodDef).super_table_base;
  (ptVar23->m_columns)._M_elems[0].offset = '\0';
  (ptVar23->m_columns)._M_elems[0].size = '\x04';
  (ptVar13->m_columns)._M_elems[1].offset = '\x04';
  (ptVar13->m_columns)._M_elems[1].size = '\x02';
  ptVar23 = &(this->MethodDef).super_table_base;
  (ptVar23->m_columns)._M_elems[2].offset = '\x06';
  (ptVar23->m_columns)._M_elems[2].size = '\x02';
  (this->MethodDef).super_table_base.m_columns._M_elems[3].offset = '\b';
  (this->MethodDef).super_table_base.m_columns._M_elems[3].size = uVar40;
  (this->MethodDef).super_table_base.m_columns._M_elems[4].offset = uVar34;
  (this->MethodDef).super_table_base.m_columns._M_elems[4].size = uVar32;
  (this->MethodDef).super_table_base.m_columns._M_elems[5].offset = uVar34 + uVar32;
  (this->MethodDef).super_table_base.m_columns._M_elems[5].size = uVar17;
  (this->MethodImpl).super_table_base.m_row_size = uVar35 + uVar28 + uVar28;
  (this->MethodImpl).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->MethodImpl).super_table_base.m_columns._M_elems[0].size = uVar35;
  (this->MethodImpl).super_table_base.m_columns._M_elems[1].offset = uVar35;
  (this->MethodImpl).super_table_base.m_columns._M_elems[1].size = uVar28;
  (this->MethodImpl).super_table_base.m_columns._M_elems[2].offset = uVar35 + uVar28;
  (this->MethodImpl).super_table_base.m_columns._M_elems[2].size = uVar28;
  bVar44 = (0xffff < (this->MethodDef).super_table_base.m_row_count) * '\x02';
  bVar19 = bVar44 | 4;
  (this->MethodSemantics).super_table_base.m_row_size = bVar19 + uVar27;
  (this->MethodSemantics).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->MethodSemantics).super_table_base.m_columns._M_elems[0].size = '\x02';
  (this->MethodSemantics).super_table_base.m_columns._M_elems[1].offset = '\x02';
  (this->MethodSemantics).super_table_base.m_columns._M_elems[1].size = bVar44 + 2;
  local_e0 = &(this->DeclSecurity).super_table_base;
  (this->MethodSemantics).super_table_base.m_columns._M_elems[2].offset = bVar19;
  local_d8 = &(this->EventMap).super_table_base;
  (this->MethodSemantics).super_table_base.m_columns._M_elems[2].size = uVar27;
  (this->MethodSpec).super_table_base.m_row_size = uVar28 + uVar32;
  local_e8 = &(this->FieldLayout).super_table_base;
  (this->MethodSpec).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->MethodSpec).super_table_base.m_columns._M_elems[0].size = uVar28;
  (this->MethodSpec).super_table_base.m_columns._M_elems[1].offset = uVar28;
  (this->MethodSpec).super_table_base.m_columns._M_elems[1].size = uVar32;
  uVar17 = (bVar12 & 2) + 2;
  uVar35 = (uint8_t)local_1c8;
  table_base::set_columns(local_130,'\x02',uVar35,uVar17,uVar17,uVar17,uVar25);
  this_02 = local_118;
  (this->ModuleRef).super_table_base.m_row_size = uVar40;
  (this->ModuleRef).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->ModuleRef).super_table_base.m_columns._M_elems[0].size = uVar40;
  uVar17 = (0xffff < (this->TypeDef).super_table_base.m_row_count) * '\x02' + '\x02';
  (this->NestedClass).super_table_base.m_row_size = uVar17 * '\x02';
  (this->NestedClass).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->NestedClass).super_table_base.m_columns._M_elems[0].size = uVar17;
  (this->NestedClass).super_table_base.m_columns._M_elems[1].offset = uVar17;
  (this->NestedClass).super_table_base.m_columns._M_elems[1].size = uVar17;
  (this->Param).super_table_base.m_row_size = uVar25;
  ptVar23 = &(this->Param).super_table_base;
  ptVar13 = &(this->Param).super_table_base;
  (ptVar23->m_columns)._M_elems[0].offset = '\0';
  (ptVar23->m_columns)._M_elems[0].size = '\x02';
  (ptVar13->m_columns)._M_elems[1].offset = '\x02';
  (ptVar13->m_columns)._M_elems[1].size = '\x02';
  (this->Param).super_table_base.m_columns._M_elems[2].offset = '\x04';
  (this->Param).super_table_base.m_columns._M_elems[2].size = uVar40;
  (this->Property).super_table_base.m_row_size = uVar32 + bVar10;
  (this->Property).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->Property).super_table_base.m_columns._M_elems[0].size = '\x02';
  (this->Property).super_table_base.m_columns._M_elems[1].offset = '\x02';
  (this->Property).super_table_base.m_columns._M_elems[1].size = uVar40;
  (this->Property).super_table_base.m_columns._M_elems[2].offset = bVar10;
  (this->Property).super_table_base.m_columns._M_elems[2].size = uVar32;
  ptVar23 = &(this->PropertyMap).super_table_base;
  uVar34 = (0xffff < (this->Property).super_table_base.m_row_count) * '\x02' + '\x02';
  (this->PropertyMap).super_table_base.m_row_size = uVar34 + uVar17;
  (this->PropertyMap).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->PropertyMap).super_table_base.m_columns._M_elems[0].size = uVar17;
  (this->PropertyMap).super_table_base.m_columns._M_elems[1].offset = uVar17;
  (this->PropertyMap).super_table_base.m_columns._M_elems[1].size = uVar34;
  (this->StandAloneSig).super_table_base.m_row_size = uVar32;
  (this->StandAloneSig).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->StandAloneSig).super_table_base.m_columns._M_elems[0].size = uVar32;
  table_base::set_columns
            (local_118,'\x04',uVar35,uVar35,(char)local_c8 * '\x02' + '\x02',
             (0xffff < (this->Field).super_table_base.m_row_count) * '\x02' + '\x02',
             (uint8_t)ptVar23);
  (this->TypeRef).super_table_base.m_row_size = uVar18 + uVar40 + uVar40;
  (this->TypeRef).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->TypeRef).super_table_base.m_columns._M_elems[0].size = uVar18;
  (this->TypeRef).super_table_base.m_columns._M_elems[1].offset = uVar18;
  (this->TypeRef).super_table_base.m_columns._M_elems[1].size = uVar40;
  (this->TypeRef).super_table_base.m_columns._M_elems[2].offset = uVar18 + uVar40;
  (this->TypeRef).super_table_base.m_columns._M_elems[2].size = uVar40;
  (this->TypeSpec).super_table_base.m_row_size = uVar32;
  (this->TypeSpec).super_table_base.m_columns._M_elems[0].offset = '\0';
  (this->TypeSpec).super_table_base.m_columns._M_elems[0].size = uVar32;
  table_base::set_data(this_01,&local_140);
  table_base::set_data((table_base *)this,&local_140);
  table_base::set_data(this_02,&local_140);
  table_base::set_data(local_c0,&local_140);
  table_base::set_data(local_b8,&local_140);
  table_base::set_data(local_b0,&local_140);
  table_base::set_data(local_a8,&local_140);
  table_base::set_data(local_120,&local_140);
  table_base::set_data(&(this->Constant).super_table_base,&local_140);
  table_base::set_data(&(this->CustomAttribute).super_table_base,&local_140);
  table_base::set_data(&(this->FieldMarshal).super_table_base,&local_140);
  table_base::set_data(local_e0,&local_140);
  table_base::set_data(&(this->ClassLayout).super_table_base,&local_140);
  table_base::set_data(local_e8,&local_140);
  table_base::set_data(local_108,&local_140);
  table_base::set_data(local_d8,&local_140);
  table_base::set_data(local_110,&local_140);
  table_base::set_data(ptVar23,&local_140);
  table_base::set_data(local_f8,&local_140);
  table_base::set_data(&(this->MethodSemantics).super_table_base,&local_140);
  table_base::set_data(&(this->MethodImpl).super_table_base,&local_140);
  table_base::set_data(local_100,&local_140);
  table_base::set_data(local_f0,&local_140);
  table_base::set_data(&(this->ImplMap).super_table_base,&local_140);
  table_base::set_data(&(this->FieldRVA).super_table_base,&local_140);
  table_base::set_data(local_a0,&local_140);
  table_base::set_data(&(this->AssemblyProcessor).super_table_base,&local_140);
  table_base::set_data(&(this->AssemblyOS).super_table_base,&local_140);
  table_base::set_data(local_128,&local_140);
  table_base::set_data(&(this->AssemblyRefProcessor).super_table_base,&local_140);
  table_base::set_data(&(this->AssemblyRefOS).super_table_base,&local_140);
  table_base::set_data(local_98,&local_140);
  table_base::set_data(local_90,&local_140);
  table_base::set_data(local_88,&local_140);
  table_base::set_data(&(this->NestedClass).super_table_base,&local_140);
  table_base::set_data(local_80,&local_140);
  table_base::set_data(local_78,&local_140);
  table_base::set_data(local_70,&local_140);
  return;
}

Assistant:

void initialize()
        {
            auto dos = m_view.as<impl::image_dos_header>();

            if (dos.e_signature != 0x5A4D) // IMAGE_DOS_SIGNATURE
            {
                impl::throw_invalid("Invalid DOS signature");
            }

            auto pe = m_view.as<impl::image_nt_headers32>(dos.e_lfanew);

            if (pe.FileHeader.NumberOfSections == 0 || pe.FileHeader.NumberOfSections > 100)
            {
                impl::throw_invalid("Invalid PE section count");
            }

            impl::image_section_header const* sections{};
            uint32_t com_virtual_address{};
            if (pe.OptionalHeader.Magic == 0x10B) // PE32
            {
                com_virtual_address = pe.OptionalHeader.DataDirectory[14].VirtualAddress; // IMAGE_DIRECTORY_ENTRY_COM_DESCRIPTOR
                sections = &m_view.as<impl::image_section_header>(dos.e_lfanew + sizeof(impl::image_nt_headers32));
            }
            else if (pe.OptionalHeader.Magic == 0x20B) // PE32+
            {
                auto pe_plus = m_view.as<impl::image_nt_headers32plus>(dos.e_lfanew);
                com_virtual_address = pe_plus.OptionalHeader.DataDirectory[14].VirtualAddress; // IMAGE_DIRECTORY_ENTRY_COM_DESCRIPTOR
                sections = &m_view.as<impl::image_section_header>(dos.e_lfanew + sizeof(impl::image_nt_headers32plus));
            }
            else
            {
                impl::throw_invalid("Invalid optional header magic value");
            }
            auto sections_end = sections + pe.FileHeader.NumberOfSections;
            auto section = section_from_rva(sections, sections_end, com_virtual_address);

            if (section == sections_end)
            {
                impl::throw_invalid("PE section containing CLI header not found");
            }

            auto offset = offset_from_rva(*section, com_virtual_address);

            auto cli = m_view.as<impl::image_cor20_header>(offset);

            if (cli.cb != sizeof(impl::image_cor20_header))
            {
                impl::throw_invalid("Invalid CLI header");
            }

            section = section_from_rva(sections, sections_end, cli.MetaData.VirtualAddress);

            if (section == sections_end)
            {
                impl::throw_invalid("PE section containing CLI metadata not found");
            }

            offset = offset_from_rva(*section, cli.MetaData.VirtualAddress);

            if (m_view.as<uint32_t>(offset) != 0x424a5342)
            {
                impl::throw_invalid("CLI metadata magic signature not found");
            }

            auto version_length = m_view.as<uint32_t>(offset + 12);
            auto stream_count = m_view.as<uint16_t>(offset + version_length + 18);
            auto view = m_view.seek(offset + version_length + 20);
            byte_view tables;

            for (uint16_t i{}; i < stream_count; ++i)
            {
                auto stream = view.as<stream_range>();
                auto name = view.as<std::array<char, 12>>(8);

                if (name.data() == "#Strings"sv)
                {
                    m_strings = m_view.sub(offset + stream.offset, stream.size);
                }
                else if (name.data() == "#Blob"sv)
                {
                    m_blobs = m_view.sub(offset + stream.offset, stream.size);
                }
                else if (name.data() == "#GUID"sv)
                {
                    m_guids = m_view.sub(offset + stream.offset, stream.size);
                }
                else if (name.data() == "#~"sv)
                {
                    tables = m_view.sub(offset + stream.offset, stream.size);
                }
                else if (name.data() != "#US"sv)
                {
                    impl::throw_invalid("Unknown metadata stream");
                }

                view = view.seek(stream_offset(name.data()));
            }

            std::bitset<8> const heap_sizes{ tables.as<uint8_t>(6) };
            uint8_t const string_index_size = heap_sizes.test(0) ? 4 : 2;
            uint8_t const guid_index_size = heap_sizes.test(1) ? 4 : 2;
            uint8_t const blob_index_size = heap_sizes.test(2) ? 4 : 2;

            std::bitset<64> const valid_bits{ tables.as<uint64_t>(8) };
            view = tables.seek(24);

            for (uint32_t i{}; i < 64; ++i)
            {
                if (!valid_bits.test(i))
                {
                    continue;
                }

                auto row_count = view.as<uint32_t>();
                view = view.seek(4);

                switch (i)
                {
                case 0x00: Module.set_row_count(row_count); break;
                case 0x01: TypeRef.set_row_count(row_count); break;
                case 0x02: TypeDef.set_row_count(row_count); break;
                case 0x04: Field.set_row_count(row_count); break;
                case 0x06: MethodDef.set_row_count(row_count); break;
                case 0x08: Param.set_row_count(row_count); break;
                case 0x09: InterfaceImpl.set_row_count(row_count); break;
                case 0x0a: MemberRef.set_row_count(row_count); break;
                case 0x0b: Constant.set_row_count(row_count); break;
                case 0x0c: CustomAttribute.set_row_count(row_count); break;
                case 0x0d: FieldMarshal.set_row_count(row_count); break;
                case 0x0e: DeclSecurity.set_row_count(row_count); break;
                case 0x0f: ClassLayout.set_row_count(row_count); break;
                case 0x10: FieldLayout.set_row_count(row_count); break;
                case 0x11: StandAloneSig.set_row_count(row_count); break;
                case 0x12: EventMap.set_row_count(row_count); break;
                case 0x14: Event.set_row_count(row_count); break;
                case 0x15: PropertyMap.set_row_count(row_count); break;
                case 0x17: Property.set_row_count(row_count); break;
                case 0x18: MethodSemantics.set_row_count(row_count); break;
                case 0x19: MethodImpl.set_row_count(row_count); break;
                case 0x1a: ModuleRef.set_row_count(row_count); break;
                case 0x1b: TypeSpec.set_row_count(row_count); break;
                case 0x1c: ImplMap.set_row_count(row_count); break;
                case 0x1d: FieldRVA.set_row_count(row_count); break;
                case 0x20: Assembly.set_row_count(row_count); break;
                case 0x21: AssemblyProcessor.set_row_count(row_count); break;
                case 0x22: AssemblyOS.set_row_count(row_count); break;
                case 0x23: AssemblyRef.set_row_count(row_count); break;
                case 0x24: AssemblyRefProcessor.set_row_count(row_count); break;
                case 0x25: AssemblyRefOS.set_row_count(row_count); break;
                case 0x26: File.set_row_count(row_count); break;
                case 0x27: ExportedType.set_row_count(row_count); break;
                case 0x28: ManifestResource.set_row_count(row_count); break;
                case 0x29: NestedClass.set_row_count(row_count); break;
                case 0x2a: GenericParam.set_row_count(row_count); break;
                case 0x2b: MethodSpec.set_row_count(row_count); break;
                case 0x2c: GenericParamConstraint.set_row_count(row_count); break;
                default: impl::throw_invalid("Unknown metadata table");
                };
            }

            table_base const empty_table{ nullptr };

            auto const TypeDefOrRef = composite_index_size(TypeDef, TypeRef, TypeSpec);
            auto const HasConstant = composite_index_size(Field, Param, Property);
            auto const HasCustomAttribute = composite_index_size(MethodDef, Field, TypeRef, TypeDef, Param, InterfaceImpl, MemberRef, Module, Property, Event, StandAloneSig, ModuleRef, TypeSpec, Assembly, AssemblyRef, File, ExportedType, ManifestResource, GenericParam, GenericParamConstraint, MethodSpec);
            auto const HasFieldMarshal = composite_index_size(Field, Param);
            auto const HasDeclSecurity = composite_index_size(TypeDef, MethodDef, Assembly);
            auto const MemberRefParent = composite_index_size(TypeDef, TypeRef, ModuleRef, MethodDef, TypeSpec);
            auto const HasSemantics = composite_index_size(Event, Property);
            auto const MethodDefOrRef = composite_index_size(MethodDef, MemberRef);
            auto const MemberForwarded = composite_index_size(Field, MethodDef);
            auto const Implementation = composite_index_size(File, AssemblyRef, ExportedType);
            auto const CustomAttributeType = composite_index_size(MethodDef, MemberRef, empty_table, empty_table, empty_table);
            auto const ResolutionScope = composite_index_size(Module, ModuleRef, AssemblyRef, TypeRef);
            auto const TypeOrMethodDef = composite_index_size(TypeDef, MethodDef);

            Assembly.set_columns(4, 8, 4, blob_index_size, string_index_size, string_index_size);
            AssemblyOS.set_columns(4, 4, 4);
            AssemblyProcessor.set_columns(4);
            AssemblyRef.set_columns(8, 4, blob_index_size, string_index_size, string_index_size, blob_index_size);
            AssemblyRefOS.set_columns(4, 4, 4, AssemblyRef.index_size());
            AssemblyRefProcessor.set_columns(4, AssemblyRef.index_size());
            ClassLayout.set_columns(2, 4, TypeDef.index_size());
            Constant.set_columns(2, HasConstant, blob_index_size);
            CustomAttribute.set_columns(HasCustomAttribute, CustomAttributeType, blob_index_size);
            DeclSecurity.set_columns(2, HasDeclSecurity, blob_index_size);
            EventMap.set_columns(TypeDef.index_size(), Event.index_size());
            Event.set_columns(2, string_index_size, TypeDefOrRef);
            ExportedType.set_columns(4, 4, string_index_size, string_index_size, Implementation);
            Field.set_columns(2, string_index_size, blob_index_size);
            FieldLayout.set_columns(4, Field.index_size());
            FieldMarshal.set_columns(HasFieldMarshal, blob_index_size);
            FieldRVA.set_columns(4, Field.index_size());
            File.set_columns(4, string_index_size, blob_index_size);
            GenericParam.set_columns(2, 2, TypeOrMethodDef, string_index_size);
            GenericParamConstraint.set_columns(GenericParam.index_size(), TypeDefOrRef);
            ImplMap.set_columns(2, MemberForwarded, string_index_size, ModuleRef.index_size());
            InterfaceImpl.set_columns(TypeDef.index_size(), TypeDefOrRef);
            ManifestResource.set_columns(4, 4, string_index_size, Implementation);
            MemberRef.set_columns(MemberRefParent, string_index_size, blob_index_size);
            MethodDef.set_columns(4, 2, 2, string_index_size, blob_index_size, Param.index_size());
            MethodImpl.set_columns(TypeDef.index_size(), MethodDefOrRef, MethodDefOrRef);
            MethodSemantics.set_columns(2, MethodDef.index_size(), HasSemantics);
            MethodSpec.set_columns(MethodDefOrRef, blob_index_size);
            Module.set_columns(2, string_index_size, guid_index_size, guid_index_size, guid_index_size);
            ModuleRef.set_columns(string_index_size);
            NestedClass.set_columns(TypeDef.index_size(), TypeDef.index_size());
            Param.set_columns(2, 2, string_index_size);
            Property.set_columns(2, string_index_size, blob_index_size);
            PropertyMap.set_columns(TypeDef.index_size(), Property.index_size());
            StandAloneSig.set_columns(blob_index_size);
            TypeDef.set_columns(4, string_index_size, string_index_size, TypeDefOrRef, Field.index_size(), MethodDef.index_size());
            TypeRef.set_columns(ResolutionScope, string_index_size, string_index_size);
            TypeSpec.set_columns(blob_index_size);

            Module.set_data(view);
            TypeRef.set_data(view);
            TypeDef.set_data(view);
            Field.set_data(view);
            MethodDef.set_data(view);
            Param.set_data(view);
            InterfaceImpl.set_data(view);
            MemberRef.set_data(view);
            Constant.set_data(view);
            CustomAttribute.set_data(view);
            FieldMarshal.set_data(view);
            DeclSecurity.set_data(view);
            ClassLayout.set_data(view);
            FieldLayout.set_data(view);
            StandAloneSig.set_data(view);
            EventMap.set_data(view);
            Event.set_data(view);
            PropertyMap.set_data(view);
            Property.set_data(view);
            MethodSemantics.set_data(view);
            MethodImpl.set_data(view);
            ModuleRef.set_data(view);
            TypeSpec.set_data(view);
            ImplMap.set_data(view);
            FieldRVA.set_data(view);
            Assembly.set_data(view);
            AssemblyProcessor.set_data(view);
            AssemblyOS.set_data(view);
            AssemblyRef.set_data(view);
            AssemblyRefProcessor.set_data(view);
            AssemblyRefOS.set_data(view);
            File.set_data(view);
            ExportedType.set_data(view);
            ManifestResource.set_data(view);
            NestedClass.set_data(view);
            GenericParam.set_data(view);
            MethodSpec.set_data(view);
            GenericParamConstraint.set_data(view);
        }